

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O0

uint32_t __thiscall
event_track::DASHEventMessageBoxv1::parse
          (DASHEventMessageBoxv1 *this,char *ptr,uint data_size,uint64_t presentation_time)

{
  uint32_t uVar1;
  ostream *this_00;
  uint64_t uVar2;
  char *pcVar3;
  long lVar4;
  value_type_conflict local_f9;
  uint local_f8;
  allocator<char> local_f1;
  uint i_1;
  allocator<char> local_c9;
  string local_c8 [32];
  uint64_t local_a8;
  uint64_t offset_1;
  uint local_98;
  allocator<char> local_91;
  uint i;
  allocator<char> local_59;
  string local_58 [32];
  uint64_t local_38;
  uint64_t offset;
  uint64_t presentation_time_local;
  char *pcStack_20;
  uint data_size_local;
  char *ptr_local;
  DASHEventMessageBoxv1 *this_local;
  
  if (data_size < 9) {
    this_local._4_4_ = 0;
  }
  else {
    offset = presentation_time;
    presentation_time_local._4_4_ = data_size;
    pcStack_20 = ptr;
    ptr_local = (char *)this;
    if (ptr[8] == '\x01') {
      this_00 = std::operator<<((ostream *)&std::cout,"emsg v1");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      fmp4_stream::full_box::parse(&this->super_full_box,pcStack_20);
      local_38 = fmp4_stream::full_box::size(&this->super_full_box);
      uVar1 = anon_unknown.dwarf_2f8d8::fmp4_read_uint32(pcStack_20 + local_38);
      *(uint32_t *)&(this->super_full_box).field_0x6c = uVar1;
      local_38 = local_38 + 4;
      uVar2 = anon_unknown.dwarf_2f8d8::fmp4_read_uint64(pcStack_20 + local_38);
      this->presentation_time_ = uVar2;
      local_38 = local_38 + 8;
      uVar1 = anon_unknown.dwarf_2f8d8::fmp4_read_uint32(pcStack_20 + local_38);
      this->event_duration_ = uVar1;
      local_38 = local_38 + 4;
      uVar1 = anon_unknown.dwarf_2f8d8::fmp4_read_uint32(pcStack_20 + local_38);
      this->id_ = uVar1;
      local_38 = local_38 + 4;
      pcVar3 = pcStack_20 + local_38;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_58,pcVar3,&local_59);
      std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,local_58);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator(&local_59);
      uVar2 = local_38;
      lVar4 = std::__cxx11::string::size();
      local_38 = uVar2 + 1 + lVar4;
      pcVar3 = pcStack_20 + local_38;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&i,pcVar3,&local_91);
      std::__cxx11::string::operator=((string *)&this->value_,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator(&local_91);
      uVar2 = local_38;
      lVar4 = std::__cxx11::string::size();
      local_38 = uVar2 + lVar4 + 1;
      for (local_98 = (uint)local_38; local_98 < (this->super_full_box).super_box.size_;
          local_98 = local_98 + 1) {
        offset_1._7_1_ = pcStack_20[local_98];
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->message_data_,(value_type_conflict *)((long)&offset_1 + 7));
      }
    }
    else {
      fmp4_stream::full_box::parse(&this->super_full_box,ptr);
      local_a8 = fmp4_stream::full_box::size(&this->super_full_box);
      pcVar3 = pcStack_20 + local_a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_c8,pcVar3,&local_c9);
      std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,local_c8);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator(&local_c9);
      uVar2 = local_a8;
      lVar4 = std::__cxx11::string::size();
      local_a8 = uVar2 + 1 + lVar4;
      pcVar3 = pcStack_20 + local_a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&i_1,pcVar3,&local_f1);
      std::__cxx11::string::operator=((string *)&this->value_,(string *)&i_1);
      std::__cxx11::string::~string((string *)&i_1);
      std::allocator<char>::~allocator(&local_f1);
      uVar2 = local_a8;
      lVar4 = std::__cxx11::string::size();
      local_a8 = uVar2 + lVar4 + 1;
      uVar1 = anon_unknown.dwarf_2f8d8::fmp4_read_uint32(pcStack_20 + local_a8);
      *(uint32_t *)&(this->super_full_box).field_0x6c = uVar1;
      local_a8 = local_a8 + 4;
      uVar1 = anon_unknown.dwarf_2f8d8::fmp4_read_uint32(pcStack_20 + local_a8);
      this->presentation_time_ = uVar1 + offset;
      local_a8 = local_a8 + 4;
      uVar1 = anon_unknown.dwarf_2f8d8::fmp4_read_uint32(pcStack_20 + local_a8);
      this->event_duration_ = uVar1;
      local_a8 = local_a8 + 4;
      uVar1 = anon_unknown.dwarf_2f8d8::fmp4_read_uint32(pcStack_20 + local_a8);
      this->id_ = uVar1;
      local_a8 = local_a8 + 4;
      for (local_f8 = (uint)local_a8; local_f8 < (this->super_full_box).super_box.size_;
          local_f8 = local_f8 + 1) {
        local_f9 = pcStack_20[local_f8];
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->message_data_,&local_f9);
      }
    }
    this_local._4_4_ = (this->super_full_box).super_box.size_;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t parse(const char *ptr, unsigned int data_size, uint64_t presentation_time = 0)
		{
			
			if (data_size > 8)
			{
				if ((uint8_t)*(ptr + 8) == 0x01) {
					std::cout << "emsg v1" << std::endl;

					fmp4_stream::full_box::parse(ptr);
					uint64_t offset = full_box::size();

					timescale_ = fmp4_read_uint32(ptr + offset);
					//cout << "timescale: " << timescale << endl;
					offset += 4;
					presentation_time_ = fmp4_read_uint64(ptr + offset);
					//cout << "presentation time: " << presentation_time << endl;
					offset += 8;
					event_duration_ = fmp4_read_uint32(ptr + offset);
					//cout << "event duration: " << event_duration << endl;
					offset += 4;
					id_ = fmp4_read_uint32(ptr + offset);
					offset += 4;
					//cout << "id: " << id << endl;
					scheme_id_uri_ = std::string(ptr + offset);
					offset = offset + scheme_id_uri_.size() + 1;
					//cout << "scheme_id_uri: " << scheme_id_uri << endl;
					value_ = std::string(ptr + offset);
					//cout << "value: " << value << endl;
					offset = offset + value_.size() + 1;

					for (unsigned int i = (unsigned int)offset; i < size_; i++)
						message_data_.push_back(*(ptr + (size_t)i));
				}
				else 
				{
					fmp4_stream::full_box::parse(ptr);
					uint64_t offset = full_box::size();
                    
					scheme_id_uri_ = std::string(ptr + offset);
					offset = offset + scheme_id_uri_.size() + 1;
					value_ = std::string(ptr + offset);
					offset = offset + value_.size() + 1;
					timescale_ = fmp4_read_uint32(ptr + offset);
					//cout << "timescale: " << timescale << endl;
					offset += 4;
					presentation_time_ = fmp4_read_uint32(ptr + offset) + presentation_time;
					//cout << "presentation time: " << presentation_time << endl;
					offset += 4;
					event_duration_ = fmp4_read_uint32(ptr + offset);
					//cout << "event duration: " << event_duration << endl;
					offset += 4;
					id_ = fmp4_read_uint32(ptr + offset);
					offset += 4;
					//cout << "id: " << id << endl;

					for (unsigned int i = (unsigned int)offset; i < size_; i++)
						message_data_.push_back(*(ptr + (size_t)i));
				}
				return size_;
			}
			return 0;
		}